

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O1

bool google::protobuf::io::Tokenizer::TryParseFloat(string *text,double *result)

{
  char *str;
  byte *pbVar1;
  byte *in_RAX;
  bool bVar2;
  double dVar3;
  char *end;
  byte *local_28;
  
  str = (text->_M_dataplus)._M_p;
  local_28 = in_RAX;
  dVar3 = NoLocaleStrtod(str,(char **)&local_28);
  *result = dVar3;
  pbVar1 = local_28;
  if ((*local_28 | 0x20) == 0x65) {
    if ((local_28[1] == 0x2d) || (pbVar1 = local_28 + 1, local_28[1] == 0x2b)) {
      pbVar1 = local_28 + 2;
    }
  }
  local_28 = pbVar1;
  if ((*local_28 | 0x20) == 0x66) {
    local_28 = local_28 + 1;
  }
  if ((long)local_28 - (long)str == text->_M_string_length) {
    bVar2 = *str != '-';
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Tokenizer::TryParseFloat(const std::string& text, double* result) {
  const char* start = text.c_str();
  char* end;
  *result = NoLocaleStrtod(start, &end);

  // "1e" is not a valid float, but if the tokenizer reads it, it will
  // report an error but still return it as a valid token.  We need to
  // accept anything the tokenizer could possibly return, error or not.
  if (*end == 'e' || *end == 'E') {
    ++end;
    if (*end == '-' || *end == '+') ++end;
  }

  // If the Tokenizer had allow_f_after_float_ enabled, the float may be
  // suffixed with the letter 'f'.
  if (*end == 'f' || *end == 'F') {
    ++end;
  }

  return static_cast<size_t>(end - start) == text.size() && *start != '-';
}